

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddImage.c
# Opt level: O0

DdNode * Extra_bddImageCompute(Extra_ImageTree_t *pTree,DdNode *bCare)

{
  DdManager *dd_00;
  DdNode *n;
  DdNode *n_00;
  DdNode *bRem;
  DdNode *bSupp;
  DdManager *dd;
  DdNode *bCare_local;
  Extra_ImageTree_t *pTree_local;
  
  dd_00 = pTree->pCare->dd;
  pTree->nIter = pTree->nIter + 1;
  n = Cudd_Support(dd_00,bCare);
  Cudd_Ref(n);
  if (n != pTree->bCareSupp) {
    n_00 = Cudd_bddExistAbstract(dd_00,n,pTree->bCareSupp);
    Cudd_Ref(n_00);
    if (n_00 != dd_00->one) {
      printf("Original care set support: ");
      printf("%s = ","pTree->bCareSupp");
      Extra_bddPrint(dd_00,pTree->bCareSupp);
      printf("\n");
      printf("Current care set support: ");
      printf("%s = ","bSupp");
      Extra_bddPrint(dd_00,n);
      printf("\n");
      Cudd_RecursiveDeref(dd_00,n);
      Cudd_RecursiveDeref(dd_00,n_00);
      printf("The care set depends on some vars that were not in the care set during scheduling.\n")
      ;
      return (DdNode *)0x0;
    }
    Cudd_RecursiveDeref(dd_00,n_00);
  }
  Cudd_RecursiveDeref(dd_00,n);
  Cudd_RecursiveDeref(dd_00,pTree->pCare->bImage);
  pTree->pCare->bImage = bCare;
  Cudd_Ref(bCare);
  pTree->nNodesMax = 0;
  Extra_bddImageCompute_rec(pTree,pTree->pRoot);
  if (pTree->nNodesMaxT < pTree->nNodesMax) {
    pTree->nNodesMaxT = pTree->nNodesMax;
  }
  return pTree->pRoot->bImage;
}

Assistant:

DdNode * Extra_bddImageCompute( Extra_ImageTree_t * pTree, DdNode * bCare )
{
    DdManager * dd = pTree->pCare->dd;
    DdNode * bSupp, * bRem;

    pTree->nIter++;

    // make sure the supports are okay
    bSupp = Cudd_Support( dd, bCare );        Cudd_Ref( bSupp );
    if ( bSupp != pTree->bCareSupp )
    {
        bRem = Cudd_bddExistAbstract( dd, bSupp, pTree->bCareSupp );  Cudd_Ref( bRem );
        if ( bRem != b1 )
        {
printf( "Original care set support: " );
ABC_PRB( dd, pTree->bCareSupp );
printf( "Current care set support: " );
ABC_PRB( dd, bSupp );
            Cudd_RecursiveDeref( dd, bSupp );
            Cudd_RecursiveDeref( dd, bRem );
            printf( "The care set depends on some vars that were not in the care set during scheduling.\n" );
            return NULL;
        }
        Cudd_RecursiveDeref( dd, bRem );
    }
    Cudd_RecursiveDeref( dd, bSupp );

    // remove the previous image
    Cudd_RecursiveDeref( dd, pTree->pCare->bImage );
    pTree->pCare->bImage = bCare;   Cudd_Ref( bCare );

    // compute the image
    pTree->nNodesMax = 0;
    Extra_bddImageCompute_rec( pTree, pTree->pRoot );
    if ( pTree->nNodesMaxT < pTree->nNodesMax )
        pTree->nNodesMaxT = pTree->nNodesMax;

//    if ( pTree->fVerbose )
//        printf( "Iter %2d : Max nodes = %5d.\n", pTree->nIter, pTree->nNodesMax );
    return pTree->pRoot->bImage;
}